

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_parse_check(arg_hdr **table,arg_end *endtable)

{
  void *parent_00;
  int error;
  long lVar1;
  int errorcode;
  void *parent;
  int tabindex;
  arg_end *endtable_local;
  arg_hdr **table_local;
  
  parent._4_4_ = 0;
  do {
    if (table[parent._4_4_]->checkfn != (arg_checkfn *)0x0) {
      parent_00 = table[parent._4_4_]->parent;
      error = (*table[parent._4_4_]->checkfn)(parent_00);
      if (error != 0) {
        arg_register_error(endtable,parent_00,error,(char *)0x0);
      }
    }
    lVar1 = (long)parent._4_4_;
    parent._4_4_ = parent._4_4_ + 1;
  } while ((table[lVar1]->flag & 1U) == 0);
  return;
}

Assistant:

static void arg_parse_check(struct arg_hdr** table, struct arg_end* endtable) {
    int tabindex = 0;
    /* printf("arg_parse_check()\n"); */
    do {
        if (table[tabindex]->checkfn) {
            void* parent = table[tabindex]->parent;
            int errorcode = table[tabindex]->checkfn(parent);
            if (errorcode != 0)
                arg_register_error(endtable, parent, errorcode, NULL);
        }
    } while (!(table[tabindex++]->flag & ARG_TERMINATOR));
}